

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  uint *puVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_source_mgr *pjVar3;
  ulong uVar4;
  d_derived_tbl *htbl;
  d_derived_tbl *htbl_00;
  jpeg_marker_reader *pjVar5;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var6;
  boolean bVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  _func_void_j_decompress_ptr *p_Var18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  JBLOCKROW paJVar25;
  uint uVar26;
  byte *pbVar27;
  jpeg_entropy_decoder *pjVar28;
  JBLOCKROW local_b8;
  bitread_working_state br_state;
  undefined8 local_58;
  undefined8 uStack_50;
  boolean *local_48;
  jpeg_source_mgr *local_40;
  ulong local_38;
  
  pjVar2 = cinfo->entropy;
  uVar17 = cinfo->restart_interval;
  if ((uVar17 != 0) && (*(int *)&pjVar2[2].decode_mcu == 0)) {
    pjVar5 = cinfo->marker;
    puVar1 = &pjVar5->discarded_bytes;
    *puVar1 = *puVar1 + *(int *)&pjVar2[1].decode_mcu / 8;
    *(undefined4 *)&pjVar2[1].decode_mcu = 0;
    bVar7 = (*pjVar5->read_restart_marker)(cinfo);
    if (bVar7 == 0) {
      return 0;
    }
    for (lVar11 = 0; lVar11 < cinfo->comps_in_scan; lVar11 = lVar11 + 1) {
      (&pjVar2[1].insufficient_data)[lVar11] = 0;
    }
    *(uint *)&pjVar2[2].decode_mcu = cinfo->restart_interval;
    if (cinfo->unread_marker == 0) {
      pjVar2->insufficient_data = 0;
    }
  }
  pjVar3 = cinfo->src;
  uVar4 = pjVar3->bytes_in_buffer;
  uVar19 = cinfo->blocks_in_MCU;
  uVar21 = (ulong)(int)uVar19;
  if ((uVar4 < uVar21 << 9) || (cinfo->unread_marker != 0)) {
    if (pjVar2->insufficient_data != 0) goto LAB_0013d38d;
    pjVar28 = cinfo->entropy;
    pbVar8 = pjVar3->next_input_byte;
    goto LAB_0013d3b5;
  }
  if (pjVar2->insufficient_data != 0) goto LAB_0013d38d;
  pjVar28 = cinfo->entropy;
  pbVar8 = pjVar3->next_input_byte;
  if (uVar17 == 0) {
    local_40 = pjVar3;
    p_Var18 = pjVar28[1].start_pass;
    uVar10 = (ulong)*(uint *)&pjVar28[1].decode_mcu;
    local_48 = &pjVar28[1].insufficient_data;
    br_state.next_input_byte = *(JOCTET **)&pjVar28[1].insufficient_data;
    br_state.bytes_in_buffer = (size_t)pjVar28[2].start_pass;
    uVar17 = 0;
    local_38 = uVar21;
    uVar21 = 0;
    if (0 < (int)uVar19) {
      uVar21 = (ulong)uVar19;
    }
    pbVar27 = pbVar8;
    for (uVar16 = 0; iVar14 = (int)uVar10, uVar16 != uVar21; uVar16 = uVar16 + 1) {
      if (MCU_data == (JBLOCKROW *)0x0) {
        paJVar25 = (JBLOCKROW)0x0;
      }
      else {
        paJVar25 = MCU_data[uVar16];
      }
      p_Var6 = (&pjVar28[5].decode_mcu)[uVar16];
      lVar11 = *(long *)(&pjVar28[8].insufficient_data + uVar16 * 2);
      if (iVar14 < 0x11) {
        lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            lVar9 = (long)p_Var18 * 0x100;
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
        lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            lVar13 = lVar9 * 0x100;
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
        lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            lVar9 = lVar13 * 0x100;
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
        lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            lVar13 = lVar9 * 0x100;
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
        lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            lVar9 = lVar13 * 0x100;
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
        p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
        uVar10 = (ulong)(iVar14 + 0x30);
        if ((ulong)*pbVar27 == 0xff) {
          if (pbVar27[1] == 0) {
            pbVar27 = pbVar27 + 2;
          }
          else {
            uVar17 = (uint)pbVar27[1];
            cinfo->unread_marker = uVar17;
            p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
          }
        }
        else {
          pbVar27 = pbVar27 + 1;
        }
      }
      uVar19 = *(uint *)(p_Var6 + (ulong)((uint)((ulong)p_Var18 >> ((char)uVar10 - 8U & 0x3f)) &
                                         0xff) * 4 + 0x128);
      uVar20 = (int)uVar19 >> 8;
      uVar23 = (int)uVar10 - uVar20;
      uVar15 = (ulong)uVar23;
      if ((int)uVar20 < 9) {
        uVar19 = uVar19 & 0xff;
LAB_0013da56:
        iVar14 = (int)uVar15;
        if (uVar19 == 0) {
          iVar14 = 0;
        }
        else {
          if (iVar14 < 0x11) {
            lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = (long)p_Var18 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
            iVar14 = iVar14 + 0x30;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
          }
          uVar15 = (ulong)(iVar14 - uVar19);
          uVar23 = -1 << ((byte)uVar19 & 0x1f);
          uVar20 = ~uVar23 & (uint)((ulong)p_Var18 >> ((byte)(iVar14 - uVar19) & 0x3f));
          iVar14 = ((int)((-1 << ((byte)uVar19 - 1 & 0x1f)) + uVar20) >> 0x1f & uVar23 + 1) + uVar20
          ;
        }
      }
      else {
        uVar19 = (uint)((ulong)p_Var18 >> ((byte)uVar23 & 0x3f)) &
                 ~(-1 << ((byte)(uVar19 >> 8) & 0x1f));
        iVar14 = -uVar20;
        for (uVar12 = (ulong)uVar20; iVar14 = iVar14 + -1,
            *(long *)(p_Var6 + uVar12 * 8) < (long)(int)uVar19; uVar12 = uVar12 + 1) {
          uVar19 = (uint)(((ulong)p_Var18 >> ((ulong)(uint)((int)uVar10 + iVar14) & 0x3f) & 1) != 0)
                   + uVar19 * 2;
        }
        uVar15 = (uVar10 & 0xffffffff) - uVar12;
        if ((int)uVar12 < 0x11) {
          uVar19 = (uint)*(byte *)(*(long *)(p_Var6 + 0x120) + 0x11 +
                                  (ulong)(uVar19 + *(int *)(p_Var6 + uVar12 * 8 + 0x90) & 0xff));
          goto LAB_0013da56;
        }
        iVar14 = 0;
      }
      if (*(int *)((long)&pjVar28[0xc].start_pass + uVar16 * 4) != 0) {
        iVar14 = iVar14 + *(int *)((long)&br_state.next_input_byte +
                                  (long)cinfo->MCU_membership[uVar16] * 4);
        *(int *)((long)&br_state.next_input_byte + (long)cinfo->MCU_membership[uVar16] * 4) = iVar14
        ;
        if (paJVar25 != (JBLOCKROW)0x0) {
          (*paJVar25)[0] = (JCOEF)iVar14;
        }
      }
      if (((&pjVar28[0xd].insufficient_data)[uVar16] == 0) || (paJVar25 == (JBLOCKROW)0x0)) {
        for (iVar14 = 1; uVar19 = (uint)uVar15, iVar14 < 0x40; iVar14 = iVar14 + (uVar23 >> 4) + 1)
        {
          if ((int)uVar19 < 0x11) {
            lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = (long)p_Var18 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
            uVar19 = uVar19 + 0x30;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
          }
          uVar23 = *(uint *)(lVar11 + 0x128 +
                            (ulong)((uint)((ulong)p_Var18 >> ((char)uVar19 - 8U & 0x3f)) & 0xff) * 4
                            );
          uVar20 = (int)uVar23 >> 8;
          uVar10 = (ulong)(uVar19 - uVar20);
          if ((int)uVar20 < 9) {
            uVar23 = uVar23 & 0xff;
          }
          else {
            uVar23 = (uint)((ulong)p_Var18 >> ((byte)(uVar19 - uVar20) & 0x3f)) &
                     ~(-1 << ((byte)(uVar23 >> 8) & 0x1f));
            iVar22 = -uVar20;
            for (uVar15 = (ulong)uVar20; iVar22 = iVar22 + -1,
                *(long *)(lVar11 + uVar15 * 8) < (long)(int)uVar23; uVar15 = uVar15 + 1) {
              uVar23 = (uint)(((ulong)p_Var18 >> ((ulong)(uVar19 + iVar22) & 0x3f) & 1) != 0) +
                       uVar23 * 2;
            }
            if (0x10 < (int)uVar15) {
              uVar15 = (ulong)(uVar19 - (int)uVar15);
              break;
            }
            uVar10 = uVar19 - uVar15;
            uVar23 = (uint)*(byte *)(*(long *)(lVar11 + 0x120) + 0x11 +
                                    (ulong)(uVar23 + *(int *)(lVar11 + 0x90 + uVar15 * 8) & 0xff));
          }
          uVar19 = (uint)uVar10;
          if ((uVar23 & 0xf) == 0) {
            if (uVar23 >> 4 != 0xf) goto LAB_0013e380;
          }
          else {
            if ((int)uVar19 < 0x11) {
              lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = (long)p_Var18 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar13 = lVar9 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = lVar13 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar13 = lVar9 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = lVar13 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
              uVar19 = uVar19 + 0x30;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
            }
            uVar19 = uVar19 - (uVar23 & 0xf);
          }
          uVar15 = (ulong)uVar19;
        }
        uVar10 = uVar15 & 0xffffffff;
      }
      else {
        for (iVar14 = 1; uVar19 = (uint)uVar15, iVar14 < 0x40; iVar14 = iVar14 + 1) {
          if ((int)uVar19 < 0x11) {
            lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = (long)p_Var18 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar13 = lVar9 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                lVar9 = lVar13 * 0x100;
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
            p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
            uVar19 = uVar19 + 0x30;
            if ((ulong)*pbVar27 == 0xff) {
              if (pbVar27[1] == 0) {
                pbVar27 = pbVar27 + 2;
              }
              else {
                uVar17 = (uint)pbVar27[1];
                cinfo->unread_marker = uVar17;
                p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
              }
            }
            else {
              pbVar27 = pbVar27 + 1;
            }
          }
          uVar23 = *(uint *)(lVar11 + 0x128 +
                            (ulong)((uint)((ulong)p_Var18 >> ((char)uVar19 - 8U & 0x3f)) & 0xff) * 4
                            );
          uVar20 = (int)uVar23 >> 8;
          uVar10 = (ulong)(uVar19 - uVar20);
          if ((int)uVar20 < 9) {
            uVar23 = uVar23 & 0xff;
          }
          else {
            uVar23 = (uint)((ulong)p_Var18 >> ((byte)(uVar19 - uVar20) & 0x3f)) &
                     ~(-1 << ((byte)(uVar23 >> 8) & 0x1f));
            iVar22 = -uVar20;
            for (uVar15 = (ulong)uVar20; iVar22 = iVar22 + -1,
                *(long *)(lVar11 + uVar15 * 8) < (long)(int)uVar23; uVar15 = uVar15 + 1) {
              uVar23 = (uint)(((ulong)p_Var18 >> ((ulong)(uVar19 + iVar22) & 0x3f) & 1) != 0) +
                       uVar23 * 2;
            }
            if (0x10 < (int)uVar15) {
              uVar15 = (ulong)(uVar19 - (int)uVar15);
              break;
            }
            uVar10 = uVar19 - uVar15;
            uVar23 = (uint)*(byte *)(*(long *)(lVar11 + 0x120) + 0x11 +
                                    (ulong)(uVar23 + *(int *)(lVar11 + 0x90 + uVar15 * 8) & 0xff));
          }
          uVar19 = (uint)uVar10;
          uVar20 = uVar23 & 0xf;
          if (uVar20 == 0) {
            if (uVar23 >> 4 != 0xf) goto LAB_0013e380;
            iVar14 = iVar14 + 0xf;
          }
          else {
            if ((int)uVar19 < 0x11) {
              lVar9 = (long)p_Var18 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = (long)p_Var18 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar13 = lVar9 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = lVar13 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar13 = lVar9 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar13 = lVar9 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              lVar9 = lVar13 * 0x100 + (ulong)*pbVar27;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  lVar9 = lVar13 * 0x100;
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
              p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100) + *pbVar27;
              uVar19 = uVar19 + 0x30;
              if ((ulong)*pbVar27 == 0xff) {
                if (pbVar27[1] == 0) {
                  pbVar27 = pbVar27 + 2;
                }
                else {
                  uVar17 = (uint)pbVar27[1];
                  cinfo->unread_marker = uVar17;
                  p_Var18 = (_func_void_j_decompress_ptr *)(lVar9 * 0x100);
                }
              }
              else {
                pbVar27 = pbVar27 + 1;
              }
            }
            uVar19 = uVar19 - uVar20;
            iVar14 = (uVar23 >> 4) + iVar14;
            uVar23 = -1 << (sbyte)uVar20;
            uVar26 = ~uVar23 & (uint)((ulong)p_Var18 >> ((byte)uVar19 & 0x3f));
            (*paJVar25)[jpeg_natural_order[iVar14]] =
                 ((ushort)((int)((-1 << ((sbyte)uVar20 - 1U & 0x1f)) + uVar26) >> 0x1f) &
                 ((ushort)uVar23 | 1)) + (short)uVar26;
          }
          uVar15 = (ulong)uVar19;
        }
        uVar10 = uVar15 & 0xffffffff;
      }
LAB_0013e380:
    }
    if (uVar17 != 0) {
      cinfo->unread_marker = 0;
      uVar21 = local_38;
      goto LAB_0013d3b5;
    }
    local_40->next_input_byte = pbVar27;
    local_40->bytes_in_buffer = (size_t)(pbVar8 + (uVar4 - (long)pbVar27));
    pjVar28[1].start_pass = p_Var18;
    *(int *)&pjVar28[1].decode_mcu = iVar14;
    local_58._0_4_ = (boolean)br_state.next_input_byte;
    local_58._4_4_ = br_state.next_input_byte._4_4_;
    uStack_50._0_4_ = (undefined4)br_state.bytes_in_buffer;
    uStack_50._4_4_ = br_state.bytes_in_buffer._4_4_;
  }
  else {
LAB_0013d3b5:
    br_state.cinfo = cinfo;
    br_state.next_input_byte = pbVar8;
    br_state.bytes_in_buffer = uVar4;
    p_Var18 = pjVar28[1].start_pass;
    iVar14 = *(int *)&pjVar28[1].decode_mcu;
    local_58 = *(undefined8 *)&pjVar28[1].insufficient_data;
    uStack_50 = pjVar28[2].start_pass;
    for (lVar11 = 0; lVar11 < (int)uVar21; lVar11 = lVar11 + 1) {
      if (MCU_data == (JBLOCKROW *)0x0) {
        local_b8 = (JBLOCKROW)0x0;
      }
      else {
        local_b8 = MCU_data[lVar11];
      }
      htbl = (d_derived_tbl *)(&pjVar28[5].decode_mcu)[lVar11];
      htbl_00 = *(d_derived_tbl **)(&pjVar28[8].insufficient_data + lVar11 * 2);
      if (iVar14 < 8) {
        bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,0);
        if (bVar7 == 0) {
          return 0;
        }
        iVar22 = 1;
        p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
        iVar14 = br_state.bits_left;
        if (7 < br_state.bits_left) goto LAB_0013d454;
LAB_0013d47d:
        uVar17 = jpeg_huff_decode(&br_state,(bit_buf_type)p_Var18,iVar14,htbl,iVar22);
        p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
        iVar14 = br_state.bits_left;
        if ((int)uVar17 < 0) {
          return 0;
        }
      }
      else {
LAB_0013d454:
        uVar17 = htbl->lookup[(ulong)p_Var18 >> ((char)iVar14 - 8U & 0x3f) & 0xff];
        iVar22 = (int)uVar17 >> 8;
        if (8 < iVar22) goto LAB_0013d47d;
        uVar17 = uVar17 & 0xff;
        iVar14 = iVar14 - iVar22;
      }
      if (uVar17 == 0) {
        iVar22 = 0;
      }
      else {
        if ((iVar14 < (int)uVar17) &&
           (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,uVar17),
           p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer, iVar14 = br_state.bits_left
           , bVar7 == 0)) {
          return 0;
        }
        iVar14 = iVar14 - uVar17;
        uVar19 = -1 << ((byte)uVar17 & 0x1f);
        uVar23 = ~uVar19 & (uint)((ulong)p_Var18 >> ((byte)iVar14 & 0x3f));
        iVar22 = ((int)((-1 << ((byte)uVar17 - 1 & 0x1f)) + uVar23) >> 0x1f & uVar19 + 1) + uVar23;
      }
      if (*(int *)((long)&pjVar28[0xc].start_pass + lVar11 * 4) != 0) {
        iVar22 = iVar22 + *(int *)((long)&local_58 + (long)cinfo->MCU_membership[lVar11] * 4);
        *(int *)((long)&local_58 + (long)cinfo->MCU_membership[lVar11] * 4) = iVar22;
        if (local_b8 != (JBLOCKROW)0x0) {
          (*local_b8)[0] = (JCOEF)iVar22;
        }
      }
      if (((&pjVar28[0xd].insufficient_data)[lVar11] == 0) || (local_b8 == (JBLOCKROW)0x0)) {
        for (iVar22 = 1; iVar22 < 0x40; iVar22 = iVar22 + (uVar17 >> 4) + 1) {
          if (iVar14 < 8) {
            bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,0);
            if (bVar7 == 0) {
              return 0;
            }
            iVar24 = 1;
            p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            iVar14 = br_state.bits_left;
            if (7 < br_state.bits_left) goto LAB_0013d6a1;
LAB_0013d6ca:
            uVar17 = jpeg_huff_decode(&br_state,(bit_buf_type)p_Var18,iVar14,htbl_00,iVar24);
            p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            iVar14 = br_state.bits_left;
            if ((int)uVar17 < 0) {
              return 0;
            }
          }
          else {
LAB_0013d6a1:
            iVar24 = htbl_00->lookup[(ulong)p_Var18 >> ((char)iVar14 - 8U & 0x3f) & 0xff] >> 8;
            if (8 < iVar24) goto LAB_0013d6ca;
            uVar17 = htbl_00->lookup[(ulong)p_Var18 >> ((char)iVar14 - 8U & 0x3f) & 0xff] & 0xff;
            iVar14 = iVar14 - iVar24;
          }
          uVar19 = uVar17 & 0xf;
          if (uVar19 == 0) {
            if (uVar17 >> 4 != 0xf) break;
          }
          else {
            if ((iVar14 < (int)uVar19) &&
               (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,uVar19),
               p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               iVar14 = br_state.bits_left, bVar7 == 0)) {
              return 0;
            }
            iVar14 = iVar14 - uVar19;
          }
        }
      }
      else {
        for (iVar22 = 1; iVar22 < 0x40; iVar22 = iVar22 + 1) {
          if (iVar14 < 8) {
            bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,0);
            if (bVar7 == 0) {
              return 0;
            }
            iVar24 = 1;
            p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            iVar14 = br_state.bits_left;
            if (7 < br_state.bits_left) goto LAB_0013d588;
LAB_0013d5b1:
            uVar17 = jpeg_huff_decode(&br_state,(bit_buf_type)p_Var18,iVar14,htbl_00,iVar24);
            p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            iVar14 = br_state.bits_left;
            if ((int)uVar17 < 0) {
              return 0;
            }
          }
          else {
LAB_0013d588:
            iVar24 = htbl_00->lookup[(ulong)p_Var18 >> ((char)iVar14 - 8U & 0x3f) & 0xff] >> 8;
            if (8 < iVar24) goto LAB_0013d5b1;
            uVar17 = htbl_00->lookup[(ulong)p_Var18 >> ((char)iVar14 - 8U & 0x3f) & 0xff] & 0xff;
            iVar14 = iVar14 - iVar24;
          }
          uVar19 = uVar17 & 0xf;
          if (uVar19 == 0) {
            if (uVar17 >> 4 != 0xf) break;
            iVar22 = iVar22 + 0xf;
          }
          else {
            if ((iVar14 < (int)uVar19) &&
               (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)p_Var18,iVar14,uVar19),
               p_Var18 = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               iVar14 = br_state.bits_left, bVar7 == 0)) {
              return 0;
            }
            iVar14 = iVar14 - uVar19;
            iVar22 = (uVar17 >> 4) + iVar22;
            uVar17 = -1 << (sbyte)uVar19;
            uVar23 = ~uVar17 & (uint)((ulong)p_Var18 >> ((byte)iVar14 & 0x3f));
            (*local_b8)[jpeg_natural_order[iVar22]] =
                 ((ushort)((int)((-1 << ((sbyte)uVar19 - 1U & 0x1f)) + uVar23) >> 0x1f) &
                 ((ushort)uVar17 | 1)) + (short)uVar23;
          }
        }
      }
      uVar21 = (ulong)(uint)cinfo->blocks_in_MCU;
    }
    pjVar3 = cinfo->src;
    pjVar3->next_input_byte = br_state.next_input_byte;
    pjVar3->bytes_in_buffer = br_state.bytes_in_buffer;
    pjVar28[1].start_pass = p_Var18;
    *(int *)&pjVar28[1].decode_mcu = iVar14;
    local_48 = &pjVar28[1].insufficient_data;
  }
  *local_48 = (boolean)local_58;
  local_48[1] = local_58._4_4_;
  local_48[2] = (undefined4)uStack_50;
  local_48[3] = uStack_50._4_4_;
LAB_0013d38d:
  if (cinfo->restart_interval != 0) {
    *(int *)&pjVar2[2].decode_mcu = *(int *)&pjVar2[2].decode_mcu + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data ? MCU_data[blkn] : NULL;
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    if (block)
      (*block)[0] = (JCOEF)entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Figure F.20: Decode_AC_coefficients */
    for (k = 1; k <= DCTSIZE2 - 1; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
      while (arith_decode(cinfo, st + 1) == 0) {
        st += 3;  k++;
        if (k > DCTSIZE2 - 1) {
          WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
          entropy->ct = -1;                     /* spectral overflow */
          return TRUE;
        }
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        if (arith_decode(cinfo, st)) {
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (arith_decode(cinfo, st)) {
            if ((m <<= 1) == 0x8000) {
              WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
              entropy->ct = -1;                 /* magnitude overflow */
              return TRUE;
            }
            st += 1;
          }
        }
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      if (block)
        (*block)[jpeg_natural_order[k]] = (JCOEF)v;
    }
  }

  return TRUE;
}